

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_SubDVertex::TopologyHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDVertex *this,
          bool bIncludeSubdivisionProperties)

{
  bool bVar1;
  undefined7 in_register_00000011;
  uint i;
  unsigned_short vei;
  ulong uVar2;
  unsigned_short vfi;
  double dVar3;
  ON_SubDEdgePtr eptr;
  ON_SubDEdgeSharpness s;
  ON_SHA1 sha1;
  
  ON_SHA1::ON_SHA1(&sha1);
  ON_SHA1::AccumulateInteger32(&sha1,(this->super_ON_SubDComponentBase).m_id);
  if ((int)CONCAT71(in_register_00000011,bIncludeSubdivisionProperties) != 0) {
    ON_SHA1::AccumulateBytes(&sha1,&this->m_vertex_tag,1);
    ON_SHA1::AccumulateDoubleArray(&sha1,3,this->m_P);
  }
  bVar1 = IsCreaseOrCorner(this);
  if (this->m_edges != (ON_SubDEdgePtr *)0x0) {
    ON_SHA1::AccumulateInteger16(&sha1,this->m_edge_count);
    for (uVar2 = 0; uVar2 < this->m_edge_count; uVar2 = uVar2 + 1) {
      eptr.m_ptr = this->m_edges[uVar2].m_ptr;
      if ((eptr.m_ptr & 0xfffffffffffffff8) == 0) {
        ON_SHA1::AccumulateInteger32(&sha1,-1);
      }
      else {
        ON_SHA1::AccumulateInteger32(&sha1,*(ON__INT32 *)((eptr.m_ptr & 0xfffffffffffffff8) + 8));
        ON_SHA1::AccumulateInteger32(&sha1,(uint)eptr.m_ptr & 1);
        if ((~bVar1 & bIncludeSubdivisionProperties) != 0) {
          s = ON_SubDEdgePtr::RelativeSharpness(&eptr,true);
          dVar3 = ON_SubDEdgeSharpness::operator[](&s,0);
          ON_SHA1::AccumulateDouble(&sha1,dVar3);
          dVar3 = ON_SubDEdgeSharpness::operator[](&s,1);
          ON_SHA1::AccumulateDouble(&sha1,dVar3);
        }
      }
    }
  }
  if (this->m_faces != (ON_SubDFace **)0x0) {
    ON_SHA1::AccumulateInteger16(&sha1,this->m_face_count);
    for (uVar2 = 0; uVar2 < this->m_face_count; uVar2 = uVar2 + 1) {
      i = 0xffffffff;
      if (this->m_faces[uVar2] != (ON_SubDFace *)0x0) {
        i = (this->m_faces[uVar2]->super_ON_SubDComponentBase).m_id;
      }
      ON_SHA1::AccumulateInteger32(&sha1,i);
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDVertex::TopologyHash(bool bIncludeSubdivisionProperties) const
{
  ON_SHA1 sha1;
  sha1.AccumulateInteger32(m_id);
  if (bIncludeSubdivisionProperties)
  {
    sha1.AccumulateBytes(&this->m_vertex_tag, sizeof(this->m_vertex_tag));
    sha1.AccumulateDoubleArray(3, this->m_P);
  }

  if (this->IsCreaseOrCorner())
    bIncludeSubdivisionProperties = false;

  if (nullptr != this->m_edges)
  {
    sha1.AccumulateInteger16(m_edge_count);
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdgePtr eptr = this->m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
      {
        sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
      }
      else
      {
        sha1.AccumulateInteger32(e->m_id);
        sha1.AccumulateInteger32((ON__UINT32)ON_SUBD_EDGE_DIRECTION(eptr.m_ptr));
        if (bIncludeSubdivisionProperties)
        {
          // passing true here includes the edge tag in the hash.
          const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(true);
          sha1.AccumulateDouble(s[0]);
          sha1.AccumulateDouble(s[1]);
        }
      }
    }
  }

  if (nullptr != this->m_faces)
  {
    sha1.AccumulateInteger16(m_face_count);
    for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
    {
      const ON_SubDFace* f = this->m_faces[vfi];
      sha1.AccumulateInteger32(nullptr == f ? ON_UNSET_UINT_INDEX : f->m_id);
    }
  }

  return sha1.Hash();
}